

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ApproximateQuantileBindData::Copy(ApproximateQuantileBindData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  vector<float,_std::allocator<float>_> local_38;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  ::std::vector<float,_std::allocator<float>_>::vector
            (&local_38,(vector<float,_std::allocator<float>_> *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR__ApproximateQuantileBindData_019d3b08;
  pp_Var1[1] = (_func_int *)
               local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
  pp_Var1[2] = (_func_int *)
               local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
  pp_Var1[3] = (_func_int *)
               local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<ApproximateQuantileBindData>(quantiles);
	}